

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_set.h
# Opt level: O1

void __thiscall re2::DFA::StateToWorkq(DFA *this,State *s,Workq *q)

{
  int i;
  long lVar1;
  
  (q->super_SparseSet).size_ = 0;
  q->nextmark_ = q->n_;
  if (0 < s->ninst_) {
    lVar1 = 0;
    do {
      if (s->inst_[lVar1] == -1) {
        if (q->last_was_mark_ == false) {
          q->last_was_mark_ = false;
          i = q->nextmark_;
          q->nextmark_ = i + 1;
          SparseSet::insert_new(&q->super_SparseSet,i);
        }
      }
      else {
        AddToQueue(this,q,s->inst_[lVar1],s->flag_ & 0xfff);
      }
      lVar1 = lVar1 + 1;
    } while (lVar1 < s->ninst_);
  }
  return;
}

Assistant:

void clear() { size_ = 0; }